

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O2

NodeIterator __thiscall
Indexing::RetrievalAlgorithms::
__selectPotentiallyUnifiableChildren<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>>::Lhs>
          (RetrievalAlgorithms *this,IntermediateNode *n,RobSubstitution *subs,uint normInternalBank
          )

{
  _func_int *p_Var1;
  int iVar2;
  undefined4 extraout_var;
  CatIterator<Lib::SingletonIterator<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Lhs>::Node_**>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Lhs>::Node_**>_>_>
  *i;
  Top TVar3;
  VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Lhs>::Node_**>
  local_78;
  VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Lhs>::Node_**>
  local_70;
  VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Lhs>::Node_**>
  local_68;
  Lib local_60 [8];
  undefined1 local_58;
  long local_50;
  VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Lhs>::Node_**>
  local_48;
  IterTraits<Lib::CatIterator<Lib::SingletonIterator<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Lhs>::Node_**>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Lhs>::Node_**>_>_>_>
  local_40;
  
  TVar3 = Kernel::RobSubstitution::getSpecialVarTop(subs,n->childVar,normInternalBank);
  if (((undefined1  [12])TVar3._inner._inner & (undefined1  [12])0x1) == (undefined1  [12])0x0) {
    (*(n->super_Node)._vptr_Node[8])(this,n);
  }
  else {
    iVar2 = (*(n->super_Node)._vptr_Node[10])
                      (n,TVar3._inner._inner._0_8_,(ulong)TVar3._inner._inner._content[7],0);
    p_Var1 = (n->super_Node)._vptr_Node[9];
    if (CONCAT44(extraout_var,iVar2) == 0) {
      (*p_Var1)(this,n);
    }
    else {
      (*p_Var1)(&local_70,n);
      local_68._core = local_70._core;
      if (local_70._core !=
          (IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Lhs>::Node_**>
           *)0x0) {
        (local_70._core)->_refCnt = (local_70._core)->_refCnt + 1;
      }
      Lib::
      concatIters<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>>::Lhs>::Node**>>
                ((Lib *)&local_78,&local_68);
      local_60[0] = (Lib)0x1;
      local_58 = 0;
      local_48._core = local_78._core;
      if (local_78._core !=
          (IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Lhs>::Node_**>
           *)0x0) {
        (local_78._core)->_refCnt = (local_78._core)->_refCnt + 1;
      }
      local_50 = CONCAT44(extraout_var,iVar2);
      Lib::
      iterTraits<Lib::CatIterator<Lib::SingletonIterator<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>>::Lhs>::Node**>,Lib::IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>>::Lhs>::Node**>>>>
                (&local_40,local_60,i);
      Lib::
      VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Lhs>::Node_**>
      ::~VirtualIterator(&local_48);
      Lib::
      VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Lhs>::Node_**>
      ::~VirtualIterator(&local_78);
      Lib::
      VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Lhs>::Node_**>
      ::~VirtualIterator(&local_68);
      Lib::
      pvi<Lib::IterTraits<Lib::CatIterator<Lib::SingletonIterator<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>>::Lhs>::Node**>,Lib::IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>>::Lhs>::Node**>>>>>
                ((Lib *)this,&local_40);
      Lib::
      VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Lhs>::Node_**>
      ::~VirtualIterator(&local_40._iter._it2._iter);
      Lib::
      VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Lhs>::Node_**>
      ::~VirtualIterator(&local_70);
    }
  }
  return (NodeIterator)
         (IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Lhs>::Node_**>
          *)this;
}

Assistant:

static typename SubstitutionTree<LD>::NodeIterator __selectPotentiallyUnifiableChildren(typename SubstitutionTree<LD>::IntermediateNode* n, RobSubstitution& subs, unsigned normInternalBank)
      {
        unsigned specVar=n->childVar;
        auto top = subs.getSpecialVarTop(specVar, normInternalBank);
        if(top.var()) {
          return n->allChildren();
        } else {
          auto** match = n->childByTop(top, /* canCreate */ false);
          if(match) {
            return pvi(concatIters(
                         getSingletonIterator(match),
                         n->variableChildren()));
          } else {
            return n->variableChildren();
          }
        }
      }